

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QVariant * __thiscall
QGraphicsView::inputMethodQuery
          (QVariant *__return_storage_ptr__,QGraphicsView *this,InputMethodQuery query)

{
  QGraphicsViewPrivate *this_00;
  Data *pDVar1;
  QObject *pQVar2;
  bool bVar3;
  bool bVar4;
  QRectF QVar5;
  int iVar6;
  QPoint QVar7;
  undefined8 uVar8;
  undefined4 in_register_00000014;
  long in_FS_OFFSET;
  double in_XMM1_Qa;
  double dVar9;
  double dVar10;
  QRect QVar11;
  undefined1 auVar12 [16];
  QRectF local_a8;
  QRectF local_88;
  QRectF local_68;
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  pDVar1 = (this_00->scene).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     (pQVar2 = (this_00->scene).wp.value, pQVar2 == (QObject *)0x0)) {
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
    goto LAB_00633493;
  }
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(__return_storage_ptr__->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(__return_storage_ptr__->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)pQVar2 + 0x60))
            (__return_storage_ptr__,pQVar2,CONCAT44(in_register_00000014,query));
  iVar6 = ::QVariant::typeId(__return_storage_ptr__);
  if (iVar6 == 0x14) {
    ::QVariant::toRectF();
    QGraphicsViewPrivate::mapRectFromScene(&local_68,this_00,&local_88);
    QVar5.yp = local_68.yp;
    QVar5.xp = local_68.xp;
    QVar5.w = local_68.w;
    QVar5.h = local_68.h;
    ::QVariant::QVariant(&local_48,QVar5);
  }
  else {
    iVar6 = ::QVariant::typeId(__return_storage_ptr__);
    if (iVar6 == 0x1a) {
      local_88.xp = (qreal)::QVariant::toPointF();
      local_88.yp = in_XMM1_Qa;
    }
    else {
      iVar6 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar6 == 0x13) {
        auVar12 = ::QVariant::toRect();
        local_a8.xp = (qreal)auVar12._0_4_;
        local_a8.yp = (qreal)auVar12._4_4_;
        local_a8.w = (qreal)(((long)auVar12._8_4_ - (long)auVar12._0_4_) + 1);
        local_a8.h = (qreal)(((auVar12._8_8_ >> 0x20) - (auVar12._0_8_ >> 0x20)) + 1);
        QGraphicsViewPrivate::mapRectFromScene(&local_88,this_00,&local_a8);
        dVar9 = (double)((ulong)local_88.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_88.xp
        ;
        bVar3 = 2147483647.0 < dVar9;
        if (dVar9 <= -2147483648.0) {
          dVar9 = -2147483648.0;
        }
        dVar9 = (double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar9);
        QVar11.x1.m_i = (int)dVar9;
        dVar10 = (double)((ulong)local_88.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                 local_88.yp;
        bVar3 = 2147483647.0 < dVar10;
        if (dVar10 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        dVar10 = (double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar10);
        iVar6 = (int)dVar10;
        dVar9 = (local_88.xp - (double)(int)dVar9) * 0.5 + local_88.w;
        dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
        bVar3 = 2147483647.0 < dVar9;
        if (dVar9 <= -2147483648.0) {
          dVar9 = -2147483648.0;
        }
        dVar10 = (local_88.yp - (double)(int)dVar10) * 0.5 + local_88.h;
        dVar10 = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
        bVar4 = 2147483647.0 < dVar10;
        if (dVar10 <= -2147483648.0) {
          dVar10 = -2147483648.0;
        }
        QVar11.x2.m_i =
             QVar11.x1.m_i +
             (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar9) + -1;
        QVar11.y1.m_i = iVar6;
        QVar11.y2.m_i =
             iVar6 + (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar4 & (ulong)dVar10) + -1;
        ::QVariant::QVariant(&local_48,QVar11);
        goto LAB_00633480;
      }
      iVar6 = ::QVariant::typeId(__return_storage_ptr__);
      if (iVar6 != 0x19) goto LAB_00633493;
      uVar8 = ::QVariant::toPoint();
      local_88.xp = (qreal)(int)uVar8;
      local_88.yp = (qreal)(int)((ulong)uVar8 >> 0x20);
    }
    QVar7 = mapFromScene(this,(QPointF *)&local_88);
    ::QVariant::QVariant(&local_48,QVar7);
  }
LAB_00633480:
  ::QVariant::operator=(__return_storage_ptr__,&local_48);
  ::QVariant::~QVariant(&local_48);
LAB_00633493:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QVariant();

    QVariant value = d->scene->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = d->mapRectFromScene(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = mapFromScene(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = d->mapRectFromScene(value.toRect()).toRect();
    else if (value.userType() == QMetaType::QPoint)
        value = mapFromScene(value.toPoint());
    return value;
}